

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O1

int lws_buflist_aware_finished_consuming(lws *wsi,lws_tokens *ebuf,int used,int buffered,char *hint)

{
  char cVar1;
  uint uVar2;
  lws_context *plVar3;
  int iVar4;
  size_t sVar5;
  lws_log_cx *plVar6;
  int iVar7;
  
  iVar7 = 0;
  if (used != 0 || buffered == 0) {
    if (used == 0 || buffered == 0) {
      uVar2 = ebuf->len;
      iVar7 = 0;
      if (-1 < (int)(uVar2 | used) && (uVar2 - used != 0 && used <= (int)uVar2)) {
        plVar3 = (wsi->a).context;
        cVar1 = wsi->tsi;
        iVar4 = lws_buflist_append_segment
                          (&wsi->buflist,ebuf->token + (uint)used,(ulong)(uVar2 - used));
        if (iVar4 < 0) {
          iVar7 = 1;
        }
        else if (iVar4 != 0) {
          plVar6 = lwsl_wsi_get_cx(wsi);
          iVar7 = 0;
          _lws_log_cx(plVar6,lws_log_prepend_wsi,wsi,0x10,"lws_buflist_aware_finished_consuming",
                      "added to rxflow list");
          iVar4 = lws_dll2_is_detached(&wsi->dll_buflist);
          if (iVar4 != 0) {
            lws_dll2_add_head(&wsi->dll_buflist,&plVar3->pt[cVar1].dll_buflist_owner);
          }
        }
      }
    }
    else {
      if ((wsi->buflist != (lws_buflist *)0x0) &&
         (sVar5 = lws_buflist_use_segment(&wsi->buflist,(long)used), (int)sVar5 != 0)) {
        return 0;
      }
      plVar6 = lwsl_wsi_get_cx(wsi);
      _lws_log_cx(plVar6,lws_log_prepend_wsi,wsi,8,"lws_buflist_aware_finished_consuming",
                  "removed from dll_buflist");
      lws_dll2_remove(&wsi->dll_buflist);
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int
lws_buflist_aware_finished_consuming(struct lws *wsi, struct lws_tokens *ebuf,
				     int used, int buffered, const char *hint)
{
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];
	int m;

	/* it's in the buflist; we didn't use any */

	if (!used && buffered)
		return 0;

	if (used && buffered) {
		if (wsi->buflist) {
			m = (int)lws_buflist_use_segment(&wsi->buflist,
							 (size_t)used);
			if (m)
				return 0;
		}

		lwsl_wsi_info(wsi, "removed from dll_buflist");
		lws_dll2_remove(&wsi->dll_buflist);

		return 0;
	}

	/* any remainder goes on the buflist */

	if (used < ebuf->len && ebuf->len >= 0 && used >= 0) {
		m = lws_buflist_append_segment(&wsi->buflist,
					       ebuf->token + used,
					       (unsigned int)(ebuf->len - used));
		if (m < 0)
			return 1; /* OOM */
		if (m) {
			lwsl_wsi_debug(wsi, "added to rxflow list");
			if (lws_dll2_is_detached(&wsi->dll_buflist))
				lws_dll2_add_head(&wsi->dll_buflist,
					 &pt->dll_buflist_owner);
		}
	}

	return 0;
}